

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O2

bool __thiscall sptk::ScalarOperation::AddLogarithmOperation(ScalarOperation *this,double base)

{
  ModuleInterface *pMVar1;
  _func_int **pp_Var2;
  double dVar3;
  ModuleInterface *local_20;
  
  if (0.0 < base) {
    pMVar1 = (ModuleInterface *)operator_new(0x10);
    pp_Var2 = (_func_int **)operator_new(0x10);
    *pp_Var2 = (_func_int *)&PTR__OperationInterface_001167f0;
    dVar3 = log(base);
    pp_Var2[1] = (_func_int *)(1.0 / dVar3);
    pMVar1->_vptr_ModuleInterface = (_func_int **)&PTR__OperationPerformer_001164b0;
    pMVar1[1]._vptr_ModuleInterface = pp_Var2;
    local_20 = pMVar1;
    std::
    vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
    ::emplace_back<sptk::ScalarOperation::ModuleInterface*>
              ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
                *)&this->modules_,&local_20);
  }
  return 0.0 < base;
}

Assistant:

bool ScalarOperation::AddLogarithmOperation(double base) {
  if (base <= 0.0) return false;
  modules_.push_back(new OperationPerformer(new Logarithm(base)));
  return true;
}